

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O3

RegularExpression * TransformCompile(RegularExpression *__return_storage_ptr__,string *str)

{
  (__return_storage_ptr__->regmatch).startp[0] = (char *)0x0;
  (__return_storage_ptr__->regmatch).endp[0] = (char *)0x0;
  (__return_storage_ptr__->regmatch).searchstring = (char *)0x0;
  __return_storage_ptr__->program = (char *)0x0;
  cmsys::RegularExpression::compile(__return_storage_ptr__,(str->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

static cmsys::RegularExpression TransformCompile(const std::string& str)
{
  return cmsys::RegularExpression(str);
}